

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::ParsedCertificateTest_BasicConstraintsCaNoPath_Test::
~ParsedCertificateTest_BasicConstraintsCaNoPath_Test
          (ParsedCertificateTest_BasicConstraintsCaNoPath_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParsedCertificateTest, BasicConstraintsCaNoPath) {
  std::shared_ptr<const ParsedCertificate> cert =
      ParseCertificateFromFile("basic_constraints_ca_no_path.pem", {});
  ASSERT_TRUE(cert);

  EXPECT_TRUE(cert->has_basic_constraints());
  EXPECT_TRUE(cert->basic_constraints().is_ca);
  EXPECT_FALSE(cert->basic_constraints().has_path_len);
}